

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_mul_internal(mp_int *r,mp_int *a,mp_int *b,mp_int scratch)

{
  mp_int scratch_00;
  mp_int scratch_01;
  mp_int scratch_02;
  mp_int scratch_03;
  mp_int scratch_04;
  mp_int *pmVar1;
  size_t sVar2;
  size_t sVar3;
  mp_int *pmVar4;
  ulong len;
  undefined1 local_f8 [8];
  mp_int product;
  mp_int bsum;
  mp_int asum;
  mp_int s;
  mp_int r2;
  mp_int r1;
  mp_int r0;
  mp_int b1;
  mp_int a1;
  mp_int b0;
  mp_int a0;
  size_t botlen;
  size_t toplen;
  size_t inlen;
  mp_int *b_local;
  mp_int *a_local;
  mp_int *r_local;
  mp_int scratch_local;
  
  scratch_local.nw = (size_t)scratch.w;
  r_local = (mp_int *)scratch.nw;
  sVar3 = r->nw;
  sVar2 = size_t_max(a->nw,b->nw);
  sVar3 = size_t_min(sVar3,sVar2);
  pmVar1 = r_local;
  pmVar4 = (mp_int *)mp_mul_scratchspace_unary(sVar3);
  if (pmVar4 <= pmVar1) {
    mp_clear(r);
    if (((sVar3 < 0x18) || (a->nw == 0)) || (b->nw == 0)) {
      mp_mul_add_simple(r,a,b);
    }
    else {
      len = sVar3 >> 1;
      sVar2 = sVar3 - len;
      join_0x00000010_0x00000000_ = mp_make_alias(a,0,sVar2);
      join_0x00000010_0x00000000_ = mp_make_alias(b,0,sVar2);
      join_0x00000010_0x00000000_ = mp_make_alias(a,sVar2,len);
      join_0x00000010_0x00000000_ = mp_make_alias(b,sVar2,len);
      join_0x00000010_0x00000000_ = mp_make_alias(r,0,sVar2 * 2);
      join_0x00000010_0x00000000_ = mp_make_alias(r,sVar2,r->nw);
      join_0x00000010_0x00000000_ = mp_make_alias(r,sVar2 * 2,r->nw);
      scratch_00.w = (BignumInt *)scratch_local.nw;
      scratch_00.nw = (size_t)r_local;
      mp_mul_internal((mp_int *)&r1.w,(mp_int *)&b0.w,(mp_int *)&a1.w,scratch_00);
      scratch_01.w = (BignumInt *)scratch_local.nw;
      scratch_01.nw = (size_t)r_local;
      mp_mul_internal((mp_int *)&s.w,(mp_int *)&b1.w,(mp_int *)&r0.w,scratch_01);
      if (r->nw < sVar3 << 1) {
        sVar3 = size_t_min(sVar2 + len,(size_t)r2.w);
        join_0x00000010_0x00000000_ = mp_alloc_from_scratch((mp_int *)&r_local,sVar3);
        scratch_02.w = (BignumInt *)scratch_local.nw;
        scratch_02.nw = (size_t)r_local;
        mp_mul_internal((mp_int *)&asum.w,(mp_int *)&b0.w,(mp_int *)&r0.w,scratch_02);
        mp_add_into((mp_int *)&r2.w,(mp_int *)&r2.w,(mp_int *)&asum.w);
        scratch_03.w = (BignumInt *)scratch_local.nw;
        scratch_03.nw = (size_t)r_local;
        mp_mul_internal((mp_int *)&asum.w,(mp_int *)&b1.w,(mp_int *)&a1.w,scratch_03);
        mp_add_into((mp_int *)&r2.w,(mp_int *)&r2.w,(mp_int *)&asum.w);
      }
      else {
        join_0x00000010_0x00000000_ = mp_alloc_from_scratch((mp_int *)&r_local,sVar2 + 1);
        join_0x00000010_0x00000000_ = mp_alloc_from_scratch((mp_int *)&r_local,sVar2 + 1);
        mp_add_into((mp_int *)&bsum.w,(mp_int *)&b0.w,(mp_int *)&b1.w);
        mp_add_into((mp_int *)&product.w,(mp_int *)&a1.w,(mp_int *)&r0.w);
        _local_f8 = mp_alloc_from_scratch((mp_int *)&r_local,sVar2 * 2 + 1);
        scratch_04.w = (BignumInt *)scratch_local.nw;
        scratch_04.nw = (size_t)r_local;
        mp_mul_internal((mp_int *)local_f8,(mp_int *)&bsum.w,(mp_int *)&product.w,scratch_04);
        mp_sub_into((mp_int *)local_f8,(mp_int *)local_f8,(mp_int *)&r1.w);
        mp_sub_into((mp_int *)local_f8,(mp_int *)local_f8,(mp_int *)&s.w);
        mp_add_into((mp_int *)&r2.w,(mp_int *)&r2.w,(mp_int *)local_f8);
      }
    }
    return;
  }
  __assert_fail("scratch.nw >= mp_mul_scratchspace_unary(inlen)",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x3f7,"void mp_mul_internal(mp_int *, mp_int *, mp_int *, mp_int)");
}

Assistant:

static void mp_mul_internal(mp_int *r, mp_int *a, mp_int *b, mp_int scratch)
{
    size_t inlen = size_t_min(r->nw, size_t_max(a->nw, b->nw));
    assert(scratch.nw >= mp_mul_scratchspace_unary(inlen));

    mp_clear(r);

    if (inlen < KARATSUBA_THRESHOLD || a->nw == 0 || b->nw == 0) {
        /*
         * The input numbers are too small to bother optimising. Go
         * straight to the simple primitive approach.
         */
        mp_mul_add_simple(r, a, b);
        return;
    }

    /*
     * Karatsuba divide-and-conquer algorithm. We cut each input in
     * half, so that it's expressed as two big 'digits' in a giant
     * base D:
     *
     *   a = a_1 D + a_0
     *   b = b_1 D + b_0
     *
     * Then the product is of course
     *
     *   ab = a_1 b_1 D^2 + (a_1 b_0 + a_0 b_1) D + a_0 b_0
     *
     * and we compute the three coefficients by recursively calling
     * ourself to do half-length multiplications.
     *
     * The clever bit that makes this worth doing is that we only need
     * _one_ half-length multiplication for the central coefficient
     * rather than the two that it obviouly looks like, because we can
     * use a single multiplication to compute
     *
     *   (a_1 + a_0) (b_1 + b_0) = a_1 b_1 + a_1 b_0 + a_0 b_1 + a_0 b_0
     *
     * and then we subtract the other two coefficients (a_1 b_1 and
     * a_0 b_0) which we were computing anyway.
     *
     * Hence we get to multiply two numbers of length N in about three
     * times as much work as it takes to multiply numbers of length
     * N/2, which is obviously better than the four times as much work
     * it would take if we just did a long conventional multiply.
     */

    /* Break up the input as botlen + toplen, with botlen >= toplen.
     * The 'base' D is equal to 2^{botlen * BIGNUM_INT_BITS}. */
    size_t toplen = inlen / 2;
    size_t botlen = inlen - toplen;

    /* Alias bignums that address the two halves of a,b, and useful
     * pieces of r. */
    mp_int a0 = mp_make_alias(a, 0, botlen);
    mp_int b0 = mp_make_alias(b, 0, botlen);
    mp_int a1 = mp_make_alias(a, botlen, toplen);
    mp_int b1 = mp_make_alias(b, botlen, toplen);
    mp_int r0 = mp_make_alias(r, 0, botlen*2);
    mp_int r1 = mp_make_alias(r, botlen, r->nw);
    mp_int r2 = mp_make_alias(r, botlen*2, r->nw);

    /* Recurse to compute a0*b0 and a1*b1, in their correct positions
     * in the output bignum. They can't overlap. */
    mp_mul_internal(&r0, &a0, &b0, scratch);
    mp_mul_internal(&r2, &a1, &b1, scratch);

    if (r->nw < inlen*2) {
        /*
         * The output buffer isn't large enough to require the whole
         * product, so some of a1*b1 won't have been stored. In that
         * case we won't try to do the full Karatsuba optimisation;
         * we'll just recurse again to compute a0*b1 and a1*b0 - or at
         * least as much of them as the output buffer size requires -
         * and add each one in.
         */
        mp_int s = mp_alloc_from_scratch(
            &scratch, size_t_min(botlen+toplen, r1.nw));

        mp_mul_internal(&s, &a0, &b1, scratch);
        mp_add_into(&r1, &r1, &s);
        mp_mul_internal(&s, &a1, &b0, scratch);
        mp_add_into(&r1, &r1, &s);
        return;
    }

    /* a0+a1 and b0+b1 */
    mp_int asum = mp_alloc_from_scratch(&scratch, botlen+1);
    mp_int bsum = mp_alloc_from_scratch(&scratch, botlen+1);
    mp_add_into(&asum, &a0, &a1);
    mp_add_into(&bsum, &b0, &b1);

    /* Their product */
    mp_int product = mp_alloc_from_scratch(&scratch, botlen*2+1);
    mp_mul_internal(&product, &asum, &bsum, scratch);

    /* Subtract off the outer terms we already have */
    mp_sub_into(&product, &product, &r0);
    mp_sub_into(&product, &product, &r2);

    /* And add it in with the right offset. */
    mp_add_into(&r1, &r1, &product);
}